

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int make_var_dead(gen_ctx_t gen_ctx,MIR_reg_t var,int scan_var,int point,int insn_p)

{
  void **ppvVar1;
  gen_ctx_t bm;
  VARR_live_range_t *pVVar2;
  bitmap_t pVVar3;
  ulong uVar4;
  live_range_t_conflict plVar5;
  live_range_t_conflict plVar6;
  undefined4 in_register_0000000c;
  live_range_t plVar7;
  uint extraout_EDX;
  MIR_reg_t MVar8;
  size_t nb;
  gen_ctx_t gen_ctx_00;
  ulong uVar9;
  
  plVar7 = (live_range_t)CONCAT44(in_register_0000000c,point);
  uVar9 = (ulong)var;
  gen_ctx_00 = gen_ctx;
  MVar8 = var;
  if ((insn_p != 0) && (gen_ctx->lr_ctx->scan_vars_num == 0)) {
    bm = (gen_ctx_t)gen_ctx->lr_ctx->referenced_vars;
    nb = uVar9 + 1;
    gen_ctx_00 = bm;
    bitmap_expand((bitmap_t)bm,nb);
    MVar8 = (MIR_reg_t)nb;
    if (bm == (gen_ctx_t)0x0) goto LAB_0016fe7f;
    plVar7 = (live_range_t)(ulong)(var >> 6);
    ppvVar1 = &bm->curr_func_item->data + (long)plVar7;
    *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << (uVar9 & 0x3f));
  }
  pVVar2 = gen_ctx->lr_ctx->var_live_ranges;
  if (((pVVar2 == (VARR_live_range_t *)0x0) ||
      (plVar7 = (live_range_t)pVVar2->varr, plVar7 == (live_range_t)0x0)) ||
     (pVVar2->els_num <= uVar9)) {
    make_var_dead_cold_4();
LAB_0016fe75:
    make_var_dead_cold_2();
  }
  else {
    pVVar3 = gen_ctx->lr_ctx->live_vars;
    if (pVVar3 != (bitmap_t)0x0) {
      plVar6 = (live_range_t_conflict)(&plVar7->lr_bb)[uVar9];
      plVar5 = (live_range_t_conflict)(long)scan_var;
      if ((plVar5 < (live_range_t_conflict)(pVVar3->els_num << 6)) &&
         (uVar4 = pVVar3->varr[(ulong)plVar5 >> 6],
         pVVar3->varr[(ulong)plVar5 >> 6] = uVar4 & ~(1L << ((ulong)plVar5 & 0x3f)),
         (uVar4 >> ((ulong)plVar5 & 0x3f) & 1) != 0)) {
        plVar6->finish = point;
LAB_0016fe67:
        return (int)plVar5;
      }
      MVar8 = point;
      plVar5 = create_live_range(gen_ctx,point,point,plVar6);
      plVar7 = (live_range_t)pVVar2->varr;
      gen_ctx_00 = gen_ctx;
      if ((plVar7 != (live_range_t)0x0) && (uVar9 < pVVar2->els_num)) {
        (&plVar7->lr_bb)[uVar9] = (lr_bb_t_conflict)plVar5;
        goto LAB_0016fe67;
      }
      goto LAB_0016fe75;
    }
  }
  make_var_dead_cold_3();
LAB_0016fe7f:
  make_var_dead_cold_1();
  plVar6 = gen_ctx_00->lr_ctx->free_lr_list;
  if (plVar6 == (live_range_t_conflict)0x0) {
    plVar6 = (live_range_t_conflict)malloc(0x20);
    if (plVar6 == (live_range_t_conflict)0x0) {
      util_error(gen_ctx_00,"no memory");
    }
  }
  else {
    gen_ctx_00->lr_ctx->free_lr_list = plVar6->next;
  }
  if (-1 < (int)MVar8) {
    if (MVar8 <= extraout_EDX) {
      plVar6->start = MVar8;
      plVar6->finish = extraout_EDX;
      plVar6->ref_cost = 1;
      plVar6->next = plVar7;
      plVar6->lr_bb = (lr_bb_t_conflict)0x0;
      return (int)plVar6;
    }
    __assert_fail("finish < 0 || start <= finish",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  __assert_fail("start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
}

Assistant:

static inline int make_var_dead (gen_ctx_t gen_ctx, MIR_reg_t var, int scan_var, int point,
                                 int insn_p) {
  live_range_t lr;
  if (insn_p && scan_vars_num == 0) bitmap_set_bit_p (referenced_vars, var);
  lr = VARR_GET (live_range_t, var_live_ranges, var);
  if (bitmap_clear_bit_p (live_vars, scan_var)) {
    lr->finish = point;
  } else {
    /* insn with unused result: result still needs a hard register */
    VARR_SET (live_range_t, var_live_ranges, var, create_live_range (gen_ctx, point, point, lr));
  }
  return TRUE;
}